

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

uint xmlDictHashQName(uint seed,xmlChar *prefix,xmlChar *name,size_t *pplen,size_t *plen)

{
  uint uVar1;
  uint uVar2;
  size_t local_40;
  size_t i;
  uint h2;
  uint h1;
  size_t *plen_local;
  size_t *pplen_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  uint seed_local;
  
  i._4_4_ = seed ^ 0x3b00;
  i._0_4_ = seed << 0xf | seed >> 0x11;
  for (local_40 = 0; prefix[local_40] != '\0'; local_40 = local_40 + 1) {
    i._4_4_ = (prefix[local_40] + i._4_4_) * 9;
    i._0_4_ = ((i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19) * 5;
  }
  *pplen = local_40;
  i._4_4_ = (i._4_4_ + 0x3a) * 9;
  uVar1 = (i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19;
  for (local_40 = 0; i._0_4_ = uVar1 * 5, name[local_40] != '\0'; local_40 = local_40 + 1) {
    i._4_4_ = (name[local_40] + i._4_4_) * 9;
    uVar1 = (i._4_4_ + (uint)i) * 0x80 | i._4_4_ + (uint)i >> 0x19;
  }
  *plen = local_40;
  uVar1 = (uVar1 * 0x14000 | (uint)i >> 0x12) + ((uint)i ^ i._4_4_);
  uVar2 = (uVar1 >> 6 | uVar1 * 0x4000000) + (uVar1 ^ (uint)i);
  uVar1 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar2 ^ uVar1);
  return (uVar1 >> 8 | uVar1 * 0x1000000) + (uVar1 ^ uVar2) | 0x80000000;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlDictHashQName(unsigned seed, const xmlChar *prefix, const xmlChar *name,
                 size_t *pplen, size_t *plen) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; prefix[i] != 0; i++) {
        HASH_UPDATE(h1, h2, prefix[i]);
    }
    *pplen = i;

    HASH_UPDATE(h1, h2, ':');

    for (i = 0; name[i] != 0; i++) {
        HASH_UPDATE(h1, h2, name[i]);
    }
    *plen = i;

    HASH_FINISH(h1, h2);

    /*
     * Always set the upper bit of hash values since 0 means an unoccupied
     * bucket.
     */
    return(h2 | MAX_HASH_SIZE);
}